

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall
xatlas::internal::param::JacobiPreconditioner::JacobiPreconditioner
          (JacobiPreconditioner *this,Matrix *M,bool symmetric)

{
  uint32_t uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  FullVector::FullVector(&this->m_inverseDiagonal,M->m_width);
  uVar1 = M->m_width;
  if (s_print != (undefined *)0x0 && uVar1 != (M->m_array).m_base.size) {
    (*(code *)s_print)("\rASSERT: %s %s %d\n","M.isSquare()",
                       "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                       ,0x164b);
    uVar1 = M->m_width;
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      fVar3 = sparse::Matrix::getCoefficient(M,(uint32_t)uVar2,(uint32_t)uVar2);
      if (symmetric) {
        fVar4 = 1.0;
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          fVar4 = 1.0 / SQRT(ABS(fVar3));
        }
        if ((this->m_inverseDiagonal).m_array.m_base.size <= uVar2) {
LAB_001b777c:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4ae,"T &xatlas::internal::Array<float>::operator[](uint32_t) [T = float]"
                       );
        }
      }
      else {
        if ((this->m_inverseDiagonal).m_array.m_base.size <= uVar2) goto LAB_001b777c;
        fVar4 = (float)(~-(uint)(fVar3 != 0.0) & 0x3f800000 |
                       (uint)(1.0 / fVar3) & -(uint)(fVar3 != 0.0));
      }
      *(float *)((this->m_inverseDiagonal).m_array.m_base.buffer + uVar2 * 4) = fVar4;
      uVar2 = uVar2 + 1;
    } while (uVar2 < M->m_width);
  }
  return;
}

Assistant:

JacobiPreconditioner(const sparse::Matrix &M, bool symmetric) : m_inverseDiagonal(M.width())
	{
		XA_ASSERT(M.isSquare());
		for (uint32_t x = 0; x < M.width(); x++) {
			float elem = M.getCoefficient(x, x);
			//XA_DEBUG_ASSERT( elem != 0.0f ); // This can be zero in the presence of zero area triangles.
			if (symmetric) {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / sqrtf(fabsf(elem)) : 1.0f;
			} else {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / elem : 1.0f;
			}
		}
	}